

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Own<kj::NetworkAddress,_std::nullptr_t> __thiscall
kj::anon_unknown_0::SocketNetwork::getSockaddr(SocketNetwork *this,void *sockaddr,uint len)

{
  uint in_ECX;
  undefined4 in_register_00000014;
  NetworkAddress *extraout_RDX;
  Own<kj::NetworkAddress,_std::nullptr_t> OVar1;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> array;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_c7;
  NetworkAddressImpl *pNStack_c0;
  Fault f;
  
  heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>(&array,1);
  SocketAddress::SocketAddress
            ((SocketAddress *)&f,(void *)CONCAT44(in_register_00000014,len),in_ECX);
  memcpy(array.pos,&f,0x88);
  array.pos = array.pos + 1;
  _kjCondition.value =
       (bool)(*(code *)**(undefined8 **)((long)sockaddr + 0x10))
                       ((NetworkFilter *)((long)sockaddr + 0x10),&(array.ptr)->addr,
                        (array.ptr)->addrlen);
  if (_kjCondition.value == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x6d5,FAILED,"array[0].allowedBy(filter)",
               "_kjCondition,\"address blocked by restrictPeers()\"",&_kjCondition,
               (char (*) [35])"address blocked by restrictPeers()");
    kj::_::Debug::Fault::~Fault(&f);
  }
  f.exception = (Exception *)array.ptr;
  array.ptr = (SocketAddress *)0x0;
  array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
  array.endPtr = (SocketAddress *)0x0;
  heap<kj::(anonymous_namespace)::NetworkAddressImpl,kj::LowLevelAsyncIoProvider&,kj::_::NetworkFilter&,kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((kj *)&_kjCondition,*(LowLevelAsyncIoProvider **)((long)sockaddr + 8),
             (NetworkFilter *)((long)sockaddr + 0x10),
             (Array<kj::(anonymous_namespace)::SocketAddress> *)&f);
  (this->super_Network)._vptr_Network = (_func_int **)CONCAT71(uStack_c7,_kjCondition.value);
  this->lowLevel = (LowLevelAsyncIoProvider *)pNStack_c0;
  Own<kj::(anonymous_namespace)::NetworkAddressImpl,_std::nullptr_t>::~Own
            ((Own<kj::(anonymous_namespace)::NetworkAddressImpl,_std::nullptr_t> *)&_kjCondition);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)&f);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::~ArrayBuilder(&array);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<NetworkAddress> getSockaddr(const void* sockaddr, uint len) override {
    auto array = kj::heapArrayBuilder<SocketAddress>(1);
    array.add(SocketAddress(sockaddr, len));
    KJ_REQUIRE(array[0].allowedBy(filter), "address blocked by restrictPeers()") { break; }
    return Own<NetworkAddress>(heap<NetworkAddressImpl>(lowLevel, filter, array.finish()));
  }